

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::convertInitializerList
          (HlslParseContext *this,TSourceLoc *loc,TType *type,TIntermTyped *initializer,
          TIntermTyped *scalarInit)

{
  TType *type_00;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  TOperator TVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  undefined4 extraout_var_01;
  long *plVar8;
  long *plVar9;
  TArraySizes *pTVar10;
  TArraySizes *this_00;
  undefined4 extraout_var_03;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvVar11;
  const_reference pvVar12;
  size_type sVar13;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TIntermTyped *pTVar14;
  TIntermSequence *pTVar15;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar16;
  size_type sVar17;
  char *pcVar18;
  reference ppTVar19;
  undefined4 extraout_var_06;
  HlslParseContext *pHVar20;
  TIntermTyped *local_460;
  TIntermTyped *emulatedConstructorArguments;
  TString local_450;
  pool_allocator<char> local_428;
  TString local_420;
  TString local_3f8;
  pool_allocator<char> local_3d0;
  TString local_3c8;
  pool_allocator<char> local_3a0;
  TString local_398;
  TString local_370;
  pool_allocator<char> local_348;
  TString local_340;
  pool_allocator<char> local_318;
  TString local_310;
  TString local_2e8;
  int local_2bc;
  undefined1 local_2b8 [4];
  int i_3;
  TType vectorType;
  TString local_218;
  pool_allocator<char> local_1f0;
  TString local_1e8;
  TString local_1c0;
  ulong local_198;
  size_t i_2;
  size_t i_1;
  undefined1 local_180 [4];
  int i;
  TType elementType;
  int d;
  TIntermTyped *firstInit;
  TType arrayType;
  TIntermAggregate *initList;
  TIntermTyped *scalarInit_local;
  TIntermTyped *initializer_local;
  TType *type_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  undefined4 extraout_var_02;
  
  iVar3 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])();
  arrayType.spirvType = (TSpirvType *)CONCAT44(extraout_var,iVar3);
  if (((TIntermOperator *)arrayType.spirvType == (TIntermOperator *)0x0) ||
     (TVar4 = TIntermOperator::getOp((TIntermOperator *)arrayType.spirvType), TVar4 != EOpNull)) {
    uVar5 = (*type->_vptr_TType[0x18])();
    if ((uVar5 & 1) != 0) {
      return (TIntermTyped *)(HlslParseContext *)initializer;
    }
    iVar3 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xc0))();
    if ((uVar7 & 1) == 0) {
      return (TIntermTyped *)(HlslParseContext *)initializer;
    }
    arrayType.spirvType =
         (TSpirvType *)
         TIntermediate::makeAggregate
                   ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                    &initializer->super_TIntermNode);
  }
  uVar5 = (*type->_vptr_TType[0x1d])();
  if ((uVar5 & 1) != 0) {
    TType::TType((TType *)&firstInit,EbtVoid,EvqTemporary,1,0,0,false);
    TType::shallowCopy((TType *)&firstInit,type);
    iVar3 = (*type->_vptr_TType[0x13])();
    TType::copyArraySizes((TType *)&firstInit,(TArraySizes *)CONCAT44(extraout_var_01,iVar3));
    uVar5 = (*type->_vptr_TType[0x1f])();
    if ((uVar5 & 1) != 0) {
      pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                          allocator[4].alignmentMask)();
      sVar17 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar16);
      TType::changeOuterArraySize((TType *)&firstInit,(int)sVar17);
    }
    bVar2 = TType::isArrayOfArrays((TType *)&firstInit);
    if (bVar2) {
      pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                          allocator[4].alignmentMask)();
      sVar17 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar16);
      if (sVar17 != 0) {
        pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                  (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator[4].alignmentMask)();
        ppTVar19 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                             (pvVar16,0);
        iVar3 = (*(*ppTVar19)->_vptr_TIntermNode[3])();
        plVar8 = (long *)CONCAT44(extraout_var_02,iVar3);
        plVar9 = (long *)(**(code **)(*plVar8 + 0xf0))();
        uVar7 = (**(code **)(*plVar9 + 0xe8))();
        if ((uVar7 & 1) != 0) {
          pTVar10 = TType::getArraySizes((TType *)&firstInit);
          iVar3 = TArraySizes::getNumDims(pTVar10);
          plVar9 = (long *)(**(code **)(*plVar8 + 0xf0))();
          pTVar10 = (TArraySizes *)(**(code **)(*plVar9 + 0x98))();
          iVar6 = TArraySizes::getNumDims(pTVar10);
          if (iVar3 == iVar6 + 1) {
            elementType.spirvType._4_4_ = 1;
            while( true ) {
              iVar3 = elementType.spirvType._4_4_;
              pTVar10 = TType::getArraySizes((TType *)&firstInit);
              iVar6 = TArraySizes::getNumDims(pTVar10);
              if (iVar6 <= iVar3) break;
              pTVar10 = TType::getArraySizes((TType *)&firstInit);
              iVar3 = TArraySizes::getDimSize(pTVar10,elementType.spirvType._4_4_);
              if (iVar3 == 0) {
                pTVar10 = TType::getArraySizes((TType *)&firstInit);
                iVar3 = elementType.spirvType._4_4_;
                plVar9 = (long *)(**(code **)(*plVar8 + 0xf0))();
                this_00 = (TArraySizes *)(**(code **)(*plVar9 + 0x98))();
                iVar6 = TArraySizes::getDimSize(this_00,elementType.spirvType._4_4_ + -1);
                TArraySizes::setDimSize(pTVar10,iVar3,iVar6);
              }
              elementType.spirvType._4_4_ = elementType.spirvType._4_4_ + 1;
            }
          }
        }
      }
    }
    pTVar15 = (TIntermSequence *)
              (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                        allocator[4].alignmentMask)();
    iVar3 = TType::getOuterArraySize((TType *)&firstInit);
    lengthenList(this,loc,pTVar15,iVar3,scalarInit);
    TType::TType((TType *)local_180,(TType *)&firstInit,0,false);
    i_1._4_4_ = 0;
    do {
      iVar3 = i_1._4_4_;
      iVar6 = TType::getOuterArraySize((TType *)&firstInit);
      if (iVar6 <= iVar3) {
        this_local = (HlslParseContext *)
                     addConstructor(this,loc,(TIntermTyped *)arrayType.spirvType,(TType *)&firstInit
                                   );
LAB_00649b1b:
        i_1._0_4_ = 1;
        TType::~TType((TType *)local_180);
        TType::~TType((TType *)&firstInit);
        return (TIntermTyped *)this_local;
      }
      pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                          allocator[4].alignmentMask)();
      ppTVar19 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                           (pvVar16,(long)i_1._4_4_);
      iVar3 = (*(*ppTVar19)->_vptr_TIntermNode[3])();
      pTVar14 = convertInitializerList
                          (this,loc,(TType *)local_180,
                           (TIntermTyped *)CONCAT44(extraout_var_03,iVar3),scalarInit);
      pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                          allocator[4].alignmentMask)();
      ppTVar19 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                           (pvVar16,(long)i_1._4_4_);
      *ppTVar19 = &pTVar14->super_TIntermNode;
      pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                          allocator[4].alignmentMask)();
      ppTVar19 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                           (pvVar16,(long)i_1._4_4_);
      if (*ppTVar19 == (value_type)0x0) {
        this_local = (HlslParseContext *)0x0;
        goto LAB_00649b1b;
      }
      i_1._4_4_ = i_1._4_4_ + 1;
    } while( true );
  }
  uVar5 = (*type->_vptr_TType[0x25])();
  if ((uVar5 & 1) == 0) {
    uVar5 = (*type->_vptr_TType[0x1c])();
    if ((uVar5 & 1) == 0) {
      uVar5 = (*type->_vptr_TType[0x1b])();
      if ((uVar5 & 1) == 0) {
        uVar5 = (*type->_vptr_TType[0x18])();
        if ((uVar5 & 1) == 0) {
          pool_allocator<char>::pool_allocator(&local_428);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_420,"",&local_428);
          pool_allocator<char>::pool_allocator
                    ((pool_allocator<char> *)&emulatedConstructorArguments);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_450,"",(pool_allocator<char> *)&emulatedConstructorArguments);
          TType::getCompleteString(&local_3f8,type,false,true,true,true,&local_420,&local_450);
          pcVar18 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str(&local_3f8);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"unexpected initializer-list type:","initializer list",pcVar18);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_3f8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_450);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_420);
          return (TIntermTyped *)(HlslParseContext *)0x0;
        }
        pTVar15 = (TIntermSequence *)
                  (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator[4].alignmentMask)();
        lengthenList(this,loc,pTVar15,1,scalarInit);
        pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                  (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator[4].alignmentMask)();
        sVar17 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar16);
        if ((int)sVar17 != 1) {
          pool_allocator<char>::pool_allocator(&local_3a0);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_398,"",&local_3a0);
          pool_allocator<char>::pool_allocator(&local_3d0);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_3c8,"",&local_3d0);
          TType::getCompleteString(&local_370,type,false,true,true,true,&local_398,&local_3c8);
          pcVar18 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str(&local_370);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"scalar expected one element:","initializer list",pcVar18);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_370);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_3c8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_398);
          return (TIntermTyped *)(HlslParseContext *)0x0;
        }
      }
      else {
        pTVar15 = (TIntermSequence *)
                  (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator[4].alignmentMask)();
        iVar3 = (*type->_vptr_TType[0xc])();
        lengthenList(this,loc,pTVar15,iVar3,scalarInit);
        iVar3 = (*type->_vptr_TType[0xc])();
        pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                  (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator[4].alignmentMask)();
        sVar17 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar16);
        if (iVar3 != (int)sVar17) {
          pool_allocator<char>::pool_allocator(&local_318);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_310,"",&local_318);
          pool_allocator<char>::pool_allocator(&local_348);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_340,"",&local_348);
          TType::getCompleteString(&local_2e8,type,false,true,true,true,&local_310,&local_340);
          pcVar18 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str(&local_2e8);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"wrong vector size (or rows in a matrix column):","initializer list",
                     pcVar18);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_2e8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_340);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_310);
          return (TIntermTyped *)(HlslParseContext *)0x0;
        }
      }
    }
    else {
      iVar3 = TType::computeNumComponents(type);
      pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                          allocator[4].alignmentMask)();
      sVar17 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar16);
      if (iVar3 != (int)sVar17) {
        pTVar15 = (TIntermSequence *)
                  (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator[4].alignmentMask)();
        iVar3 = (*type->_vptr_TType[0xd])();
        lengthenList(this,loc,pTVar15,iVar3,scalarInit);
        iVar3 = (*type->_vptr_TType[0xd])();
        pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                  (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator[4].alignmentMask)();
        sVar17 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar16);
        if (iVar3 != (int)sVar17) {
          pool_allocator<char>::pool_allocator(&local_1f0);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_1e8,"",&local_1f0);
          pool_allocator<char>::pool_allocator((pool_allocator<char> *)&vectorType.spirvType);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_218,"",(pool_allocator<char> *)&vectorType.spirvType);
          TType::getCompleteString(&local_1c0,type,false,true,true,true,&local_1e8,&local_218);
          pcVar18 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str(&local_1c0);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"wrong number of matrix columns:","initializer list",pcVar18);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_1c0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_218);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_1e8);
          return (TIntermTyped *)(HlslParseContext *)0x0;
        }
        TType::TType((TType *)local_2b8,type,0,false);
        for (local_2bc = 0; iVar3 = local_2bc, iVar6 = (*type->_vptr_TType[0xd])(), iVar3 < iVar6;
            local_2bc = local_2bc + 1) {
          pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.
                              super_allocator_type.allocator[4].alignmentMask)();
          ppTVar19 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (pvVar16,(long)local_2bc);
          iVar3 = (*(*ppTVar19)->_vptr_TIntermNode[3])();
          pTVar14 = convertInitializerList
                              (this,loc,(TType *)local_2b8,
                               (TIntermTyped *)CONCAT44(extraout_var_05,iVar3),scalarInit);
          pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.
                              super_allocator_type.allocator[4].alignmentMask)();
          ppTVar19 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (pvVar16,(long)local_2bc);
          *ppTVar19 = &pTVar14->super_TIntermNode;
          pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.
                              super_allocator_type.allocator[4].alignmentMask)();
          ppTVar19 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (pvVar16,(long)local_2bc);
          if (*ppTVar19 == (value_type)0x0) {
            this_local = (HlslParseContext *)0x0;
            i_1._0_4_ = 1;
            goto LAB_0064a0e8;
          }
        }
        i_1._0_4_ = 0;
LAB_0064a0e8:
        TType::~TType((TType *)local_2b8);
        if ((int)i_1 != 0) {
          return (TIntermTyped *)this_local;
        }
      }
    }
  }
  else {
    pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
              (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                        allocator[4].alignmentMask)();
    i_2 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar16);
    while( true ) {
      sVar1 = i_2;
      pvVar11 = &TType::getStruct(type)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      sVar17 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                         (pvVar11);
      if (sVar17 <= sVar1) break;
      pvVar11 = &TType::getStruct(type)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      pvVar12 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                operator[](pvVar11,i_2);
      uVar5 = (*pvVar12->type->_vptr_TType[0x36])();
      if ((uVar5 & 1) != 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot implicitly initialize opaque members","initializer list","");
        return (TIntermTyped *)(HlslParseContext *)0x0;
      }
      i_2 = i_2 + 1;
    }
    pTVar15 = (TIntermSequence *)
              (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                        allocator[4].alignmentMask)();
    pvVar11 = &TType::getStruct(type)->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    sVar17 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                       (pvVar11);
    lengthenList(this,loc,pTVar15,(int)sVar17,scalarInit);
    pvVar11 = &TType::getStruct(type)->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    sVar17 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                       (pvVar11);
    pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
              (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                        allocator[4].alignmentMask)();
    sVar13 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar16);
    if (sVar17 != sVar13) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"wrong number of structure members","initializer list","");
      return (TIntermTyped *)(HlslParseContext *)0x0;
    }
    local_198 = 0;
    while( true ) {
      uVar7 = local_198;
      pvVar11 = &TType::getStruct(type)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      sVar17 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                         (pvVar11);
      if (sVar17 <= uVar7) break;
      pvVar11 = &TType::getStruct(type)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      pvVar12 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                operator[](pvVar11,local_198);
      type_00 = pvVar12->type;
      pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                          allocator[4].alignmentMask)();
      ppTVar19 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                           (pvVar16,local_198);
      iVar3 = (*(*ppTVar19)->_vptr_TIntermNode[3])();
      pTVar14 = convertInitializerList
                          (this,loc,type_00,(TIntermTyped *)CONCAT44(extraout_var_04,iVar3),
                           scalarInit);
      pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                          allocator[4].alignmentMask)();
      ppTVar19 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                           (pvVar16,local_198);
      *ppTVar19 = &pTVar14->super_TIntermNode;
      pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                          allocator[4].alignmentMask)();
      ppTVar19 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                           (pvVar16,local_198);
      if (*ppTVar19 == (value_type)0x0) {
        return (TIntermTyped *)(HlslParseContext *)0x0;
      }
      local_198 = local_198 + 1;
    }
  }
  pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
            (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                      allocator[4].alignmentMask)();
  sVar17 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar16);
  if (sVar17 == 1) {
    pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
              (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                        allocator[4].alignmentMask)();
    ppTVar19 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                         (pvVar16,0);
    iVar3 = (*(*ppTVar19)->_vptr_TIntermNode[3])();
    local_460 = (TIntermTyped *)CONCAT44(extraout_var_06,iVar3);
  }
  else {
    local_460 = (TIntermTyped *)arrayType.spirvType;
  }
  pHVar20 = (HlslParseContext *)addConstructor(this,loc,local_460,type);
  return (TIntermTyped *)pHVar20;
}

Assistant:

TIntermTyped* HlslParseContext::convertInitializerList(const TSourceLoc& loc, const TType& type,
                                                       TIntermTyped* initializer, TIntermTyped* scalarInit)
{
    // Will operate recursively.  Once a subtree is found that is constructor style,
    // everything below it is already good: Only the "top part" of the initializer
    // can be an initializer list, where "top part" can extend for several (or all) levels.

    // see if we have bottomed out in the tree within the initializer-list part
    TIntermAggregate* initList = initializer->getAsAggregate();
    if (initList == nullptr || initList->getOp() != EOpNull) {
        // We don't have a list, but if it's a scalar and the 'type' is a
        // composite, we need to lengthen below to make it useful.
        // Otherwise, this is an already formed object to initialize with.
        if (type.isScalar() || !initializer->getType().isScalar())
            return initializer;
        else
            initList = intermediate.makeAggregate(initializer);
    }

    // Of the initializer-list set of nodes, need to process bottom up,
    // so recurse deep, then process on the way up.

    // Go down the tree here...
    if (type.isArray()) {
        // The type's array might be unsized, which could be okay, so base sizes on the size of the aggregate.
        // Later on, initializer execution code will deal with array size logic.
        TType arrayType;
        arrayType.shallowCopy(type);                     // sharing struct stuff is fine
        arrayType.copyArraySizes(*type.getArraySizes()); // but get a fresh copy of the array information, to edit below

        // edit array sizes to fill in unsized dimensions
        if (type.isUnsizedArray())
            arrayType.changeOuterArraySize((int)initList->getSequence().size());

        // set unsized array dimensions that can be derived from the initializer's first element
        if (arrayType.isArrayOfArrays() && initList->getSequence().size() > 0) {
            TIntermTyped* firstInit = initList->getSequence()[0]->getAsTyped();
            if (firstInit->getType().isArray() &&
                arrayType.getArraySizes()->getNumDims() == firstInit->getType().getArraySizes()->getNumDims() + 1) {
                for (int d = 1; d < arrayType.getArraySizes()->getNumDims(); ++d) {
                    if (arrayType.getArraySizes()->getDimSize(d) == UnsizedArraySize)
                        arrayType.getArraySizes()->setDimSize(d, firstInit->getType().getArraySizes()->getDimSize(d - 1));
                }
            }
        }

        // lengthen list to be long enough
        lengthenList(loc, initList->getSequence(), arrayType.getOuterArraySize(), scalarInit);

        // recursively process each element
        TType elementType(arrayType, 0); // dereferenced type
        for (int i = 0; i < arrayType.getOuterArraySize(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, elementType,
                                                                initList->getSequence()[i]->getAsTyped(), scalarInit);
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }

        return addConstructor(loc, initList, arrayType);
    } else if (type.isStruct()) {
        // do we have implicit assignments to opaques?
        for (size_t i = initList->getSequence().size(); i < type.getStruct()->size(); ++i) {
            if ((*type.getStruct())[i].type->containsOpaque()) {
                error(loc, "cannot implicitly initialize opaque members", "initializer list", "");
                return nullptr;
            }
        }

        // lengthen list to be long enough
        lengthenList(loc, initList->getSequence(), static_cast<int>(type.getStruct()->size()), scalarInit);

        if (type.getStruct()->size() != initList->getSequence().size()) {
            error(loc, "wrong number of structure members", "initializer list", "");
            return nullptr;
        }
        for (size_t i = 0; i < type.getStruct()->size(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, *(*type.getStruct())[i].type,
                                                                initList->getSequence()[i]->getAsTyped(), scalarInit);
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }
    } else if (type.isMatrix()) {
        if (type.computeNumComponents() == (int)initList->getSequence().size()) {
            // This means the matrix is initialized component-wise, rather than as
            // a series of rows and columns.  We can just use the list directly as
            // a constructor; no further processing needed.
        } else {
            // lengthen list to be long enough
            lengthenList(loc, initList->getSequence(), type.getMatrixCols(), scalarInit);

            if (type.getMatrixCols() != (int)initList->getSequence().size()) {
                error(loc, "wrong number of matrix columns:", "initializer list", type.getCompleteString().c_str());
                return nullptr;
            }
            TType vectorType(type, 0); // dereferenced type
            for (int i = 0; i < type.getMatrixCols(); ++i) {
                initList->getSequence()[i] = convertInitializerList(loc, vectorType,
                                                                    initList->getSequence()[i]->getAsTyped(), scalarInit);
                if (initList->getSequence()[i] == nullptr)
                    return nullptr;
            }
        }
    } else if (type.isVector()) {
        // lengthen list to be long enough
        lengthenList(loc, initList->getSequence(), type.getVectorSize(), scalarInit);

        // error check; we're at bottom, so work is finished below
        if (type.getVectorSize() != (int)initList->getSequence().size()) {
            error(loc, "wrong vector size (or rows in a matrix column):", "initializer list",
                  type.getCompleteString().c_str());
            return nullptr;
        }
    } else if (type.isScalar()) {
        // lengthen list to be long enough
        lengthenList(loc, initList->getSequence(), 1, scalarInit);

        if ((int)initList->getSequence().size() != 1) {
            error(loc, "scalar expected one element:", "initializer list", type.getCompleteString().c_str());
            return nullptr;
        }
    } else {
        error(loc, "unexpected initializer-list type:", "initializer list", type.getCompleteString().c_str());
        return nullptr;
    }

    // Now that the subtree is processed, process this node as if the
    // initializer list is a set of arguments to a constructor.
    TIntermTyped* emulatedConstructorArguments;
    if (initList->getSequence().size() == 1)
        emulatedConstructorArguments = initList->getSequence()[0]->getAsTyped();
    else
        emulatedConstructorArguments = initList;

    return addConstructor(loc, emulatedConstructorArguments, type);
}